

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O0

void unprepare_permutation_ntk(saucy *s)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Nm_Man_t *pNVar5;
  char *pName;
  Abc_Obj_t *pAStack_28;
  int numouts;
  Abc_Obj_t *pObjPerm;
  Abc_Obj_t *pObj;
  int i;
  saucy *s_local;
  
  iVar1 = Abc_NtkPoNum(s->pNtk);
  Nm_ManFree(s->pNtk_permuted->pManName);
  iVar2 = Abc_NtkCiNum(s->pNtk);
  iVar3 = Abc_NtkCoNum(s->pNtk);
  iVar4 = Abc_NtkBoxNum(s->pNtk);
  pNVar5 = Nm_ManCreate(iVar2 + iVar3 + iVar4);
  s->pNtk_permuted->pManName = pNVar5;
  for (pObj._4_4_ = 0; pObj._4_4_ < s->n; pObj._4_4_ = pObj._4_4_ + 1) {
    if (pObj._4_4_ < iVar1) {
      pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos,s->gamma[pObj._4_4_]);
      pAStack_28 = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPos,pObj._4_4_);
    }
    else {
      pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis,s->gamma[pObj._4_4_] - iVar1);
      pAStack_28 = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPis,pObj._4_4_ - iVar1);
    }
    pName = Abc_ObjName(pObjPerm);
    Abc_ObjAssignName(pAStack_28,pName,(char *)0x0);
  }
  Abc_NtkOrderObjsByName(s->pNtk_permuted,1);
  return;
}

Assistant:

void
unprepare_permutation_ntk(struct saucy *s) 
{       
    int i;
    Abc_Obj_t * pObj, * pObjPerm;
    int numouts = Abc_NtkPoNum(s->pNtk);

    Nm_ManFree( s->pNtk_permuted->pManName );
    s->pNtk_permuted->pManName = Nm_ManCreate( Abc_NtkCiNum(s->pNtk) + Abc_NtkCoNum(s->pNtk) + Abc_NtkBoxNum(s->pNtk) );    

    for (i = 0; i < s->n; ++i) {        
        if (i < numouts) {
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPos, s->gamma[i]);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPos, i);         
        }
        else {          
            pObj     = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk->vPis, s->gamma[i] - numouts);
            pObjPerm = (Abc_Obj_t *)Vec_PtrEntry(s->pNtk_permuted->vPis, i - numouts);
            
        }
        Abc_ObjAssignName( pObjPerm, Abc_ObjName(pObj), NULL );         
    }

    Abc_NtkOrderObjsByName( s->pNtk_permuted, 1 );
}